

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

void __thiscall
kj::_::LogExpectation::LogExpectation(LogExpectation *this,LogSeverity severity,StringPtr substring)

{
  ExceptionCallback::ExceptionCallback(&this->super_ExceptionCallback);
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__LogExpectation_0059d770;
  this->severity = severity;
  (this->substring).content.ptr = substring.content.ptr;
  (this->substring).content.size_ = substring.content.size_;
  this->seen = false;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

LogExpectation::LogExpectation(LogSeverity severity, StringPtr substring)
    : severity(severity), substring(substring), seen(false) {}